

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O2

const_ret_type __thiscall
dlib::
op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
::apply(op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
        *this,long r,long param_2)

{
  long c;
  long c_00;
  float fVar1;
  const_ret_type cVar2;
  
  fVar1 = op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
          ::apply(&this->m->op,r,0);
  c_00 = 1;
  while( true ) {
    if ((((this->m->op).
          super_basic_op_mm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
         .m1)->op).cols <= c_00) break;
    cVar2 = op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
            ::apply(&this->m->op,r,c_00);
    c_00 = c_00 + 1;
    fVar1 = fVar1 + cVar2;
  }
  return fVar1;
}

Assistant:

const_ret_type apply ( long r, long ) const
        { 
            type temp = m(r,0);
            for (long c = 1; c < m.nc(); ++c)
                temp += m(r,c);
            return temp; 
        }